

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O3

void __thiscall Liby::TcpServer::initConnection(TcpServer *this,Connection *conn)

{
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  _Manager_type local_28;
  
  std::function<void_(Liby::Connection_&)>::function
            ((function<void_(Liby::Connection_&)> *)&local_38,&this->readEventCallback_);
  std::function<void_(Liby::Connection_&)>::operator=
            (&conn->readEventCallback_,(function<void_(Liby::Connection_&)> *)&local_38);
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpServer.cpp:25:44)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpServer.cpp:25:44)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  std::function<void_(Liby::Connection_&)>::operator=
            (&conn->erroEventCallback_,(function<void_(Liby::Connection_&)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

void TcpServer::initConnection(Connection &conn) {
    conn.onRead(readEventCallback_).onErro([this](Connection &conn) {
        auto x = conn.shared_from_this();
        if (erroEventCallback_) {
            erroEventCallback_(conn);
        }
        x->destroy();
    });
}